

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O0

void fallbackSort(UInt32 *fmap,UInt32 *eclass,UInt32 *bhtab,Int32 nblock,Int32 verb)

{
  int iVar1;
  int in_ECX;
  long lVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  UChar *eclass8;
  Int32 nBhtab;
  Int32 nNotDone;
  Int32 cc1;
  Int32 cc;
  Int32 r;
  Int32 l;
  Int32 k;
  Int32 j;
  Int32 i;
  Int32 H;
  Int32 ftabCopy [256];
  Int32 ftab [257];
  int local_84c;
  int local_844;
  uint local_840;
  uint local_838;
  int local_834;
  int local_830;
  int local_82c;
  int aiStackY_828 [210];
  Int32 in_stack_fffffffffffffb20;
  Int32 in_stack_fffffffffffffb24;
  UInt32 *in_stack_fffffffffffffb28;
  UInt32 *in_stack_fffffffffffffb30;
  int aiStack_428 [259];
  int local_1c;
  long local_18;
  long local_10;
  long local_8;
  
  for (local_830 = 0; local_830 < 0x101; local_830 = local_830 + 1) {
    aiStack_428[local_830] = 0;
  }
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_830 = 0; local_830 < local_1c; local_830 = local_830 + 1) {
    aiStack_428[*(byte *)(in_RSI + local_830)] = aiStack_428[*(byte *)(in_RSI + local_830)] + 1;
  }
  for (local_830 = 0; local_830 < 0x100; local_830 = local_830 + 1) {
    aiStackY_828[local_830] = aiStack_428[local_830];
  }
  for (local_830 = 1; local_830 < 0x101; local_830 = local_830 + 1) {
    aiStack_428[local_830] = aiStack_428[local_830 + -1] + aiStack_428[local_830];
  }
  for (local_830 = 0; local_830 < local_1c; local_830 = local_830 + 1) {
    iVar1 = aiStack_428[(int)(uint)*(byte *)(in_RSI + local_830)];
    aiStack_428[(int)(uint)*(byte *)(in_RSI + local_830)] = iVar1 + -1;
    *(int *)(local_8 + (long)(iVar1 + -1) * 4) = local_830;
  }
  for (local_830 = 0; local_830 < local_1c / 0x20 + 2; local_830 = local_830 + 1) {
    *(undefined4 *)(local_18 + (long)local_830 * 4) = 0;
  }
  for (local_830 = 0; local_830 < 0x100; local_830 = local_830 + 1) {
    *(uint *)(local_18 + (long)(aiStack_428[local_830] >> 5) * 4) =
         1 << ((byte)aiStack_428[local_830] & 0x1f) |
         *(uint *)(local_18 + (long)(aiStack_428[local_830] >> 5) * 4);
  }
  for (local_830 = 0; local_830 < 0x20; local_830 = local_830 + 1) {
    lVar2 = (long)(local_1c + local_830 * 2 >> 5);
    *(uint *)(local_18 + lVar2 * 4) =
         1 << ((char)local_1c + (char)(local_830 << 1) & 0x1fU) | *(uint *)(local_18 + lVar2 * 4);
    lVar2 = (long)(local_1c + local_830 * 2 + 1 >> 5);
    *(uint *)(local_18 + lVar2 * 4) =
         (1 << ((char)local_1c + (char)(local_830 << 1) + 1U & 0x1f) ^ 0xffffffffU) &
         *(uint *)(local_18 + lVar2 * 4);
  }
  local_82c = 1;
  do {
    local_834 = 0;
    for (local_830 = 0; local_830 < local_1c; local_830 = local_830 + 1) {
      if ((*(uint *)(local_18 + (long)(local_830 >> 5) * 4) & 1 << ((byte)local_830 & 0x1f)) != 0) {
        local_834 = local_830;
      }
      local_838 = *(int *)(local_8 + (long)local_830 * 4) - local_82c;
      if ((int)local_838 < 0) {
        local_838 = local_1c + local_838;
      }
      *(int *)(local_10 + (long)(int)local_838 * 4) = local_834;
    }
    local_84c = 0;
    local_840 = 0xffffffff;
    while( true ) {
      do {
        local_838 = local_840 + 1;
        local_840 = local_838;
      } while ((*(uint *)(local_18 + (long)((int)local_838 >> 5) * 4) &
               1 << ((byte)local_838 & 0x1f)) != 0 && (local_838 & 0x1f) != 0);
      if ((*(uint *)(local_18 + (long)((int)local_838 >> 5) * 4) & 1 << ((byte)local_838 & 0x1f)) !=
          0) {
        while (*(int *)(local_18 + (long)((int)local_838 >> 5) * 4) == -1) {
          local_838 = local_838 + 0x20;
        }
        while ((*(uint *)(local_18 + (long)((int)local_838 >> 5) * 4) &
               1 << ((byte)local_838 & 0x1f)) != 0) {
          local_838 = local_838 + 1;
        }
      }
      local_830 = local_838 - 1;
      if (local_1c <= local_830) break;
      while( true ) {
        if ((*(uint *)(local_18 + (long)((int)local_838 >> 5) * 4) & 1 << ((byte)local_838 & 0x1f))
            != 0 || (local_838 & 0x1f) == 0) break;
        local_838 = local_838 + 1;
      }
      if ((*(uint *)(local_18 + (long)((int)local_838 >> 5) * 4) & 1 << ((byte)local_838 & 0x1f)) ==
          0) {
        while (*(int *)(local_18 + (long)((int)local_838 >> 5) * 4) == 0) {
          local_838 = local_838 + 0x20;
        }
        while ((*(uint *)(local_18 + (long)((int)local_838 >> 5) * 4) &
               1 << ((byte)local_838 & 0x1f)) == 0) {
          local_838 = local_838 + 1;
        }
      }
      local_840 = local_838 - 1;
      if (local_1c <= (int)local_840) break;
      if (local_830 < (int)local_840) {
        local_84c = (local_840 - local_830) + 1 + local_84c;
        fallbackQSort3(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb24
                       ,in_stack_fffffffffffffb20);
        local_844 = -1;
        for (; local_830 <= (int)local_840; local_830 = local_830 + 1) {
          iVar1 = *(int *)(local_10 + (ulong)*(uint *)(local_8 + (long)local_830 * 4) * 4);
          if (local_844 != iVar1) {
            *(uint *)(local_18 + (long)(local_830 >> 5) * 4) =
                 1 << ((byte)local_830 & 0x1f) | *(uint *)(local_18 + (long)(local_830 >> 5) * 4);
            local_844 = iVar1;
          }
        }
      }
    }
    local_82c = local_82c << 1;
    if ((local_1c < local_82c) || (local_84c == 0)) {
      local_834 = 0;
      for (local_830 = 0; local_830 < local_1c; local_830 = local_830 + 1) {
        for (; aiStackY_828[local_834] == 0; local_834 = local_834 + 1) {
        }
        aiStackY_828[local_834] = aiStackY_828[local_834] + -1;
        *(char *)(in_RSI + (ulong)*(uint *)(local_8 + (long)local_830 * 4)) = (char)local_834;
      }
      if (0xff < local_834) {
        bz_internal_error(0x3ed);
      }
      return;
    }
  } while( true );
}

Assistant:

static
void fallbackSort ( UInt32* fmap, 
                    UInt32* eclass, 
                    UInt32* bhtab,
                    Int32   nblock,
                    Int32   verb )
{
   Int32 ftab[257];
   Int32 ftabCopy[256];
   Int32 H, i, j, k, l, r, cc, cc1;
   Int32 nNotDone;
   Int32 nBhtab;
   UChar* eclass8 = (UChar*)eclass;

   /*--
      Initial 1-char radix sort to generate
      initial fmap and initial BH bits.
   --*/
   if (verb >= 4)
      VPrintf0 ( "        bucket sorting ...\n" );
   for (i = 0; i < 257;    i++) ftab[i] = 0;
   for (i = 0; i < nblock; i++) ftab[eclass8[i]]++;
   for (i = 0; i < 256;    i++) ftabCopy[i] = ftab[i];
   for (i = 1; i < 257;    i++) ftab[i] += ftab[i-1];

   for (i = 0; i < nblock; i++) {
      j = eclass8[i];
      k = ftab[j] - 1;
      ftab[j] = k;
      fmap[k] = i;
   }

   nBhtab = 2 + (nblock / 32);
   for (i = 0; i < nBhtab; i++) bhtab[i] = 0;
   for (i = 0; i < 256; i++) SET_BH(ftab[i]);

   /*--
      Inductively refine the buckets.  Kind-of an
      "exponential radix sort" (!), inspired by the
      Manber-Myers suffix array construction algorithm.
   --*/

   /*-- set sentinel bits for block-end detection --*/
   for (i = 0; i < 32; i++) { 
      SET_BH(nblock + 2*i);
      CLEAR_BH(nblock + 2*i + 1);
   }

   /*-- the log(N) loop --*/
   H = 1;
   while (1) {

      if (verb >= 4) 
         VPrintf1 ( "        depth %6d has ", H );

      j = 0;
      for (i = 0; i < nblock; i++) {
         if (ISSET_BH(i)) j = i;
         k = fmap[i] - H; if (k < 0) k += nblock;
         eclass[k] = j;
      }

      nNotDone = 0;
      r = -1;
      while (1) {

	 /*-- find the next non-singleton bucket --*/
         k = r + 1;
         while (ISSET_BH(k) && UNALIGNED_BH(k)) k++;
         if (ISSET_BH(k)) {
            while (WORD_BH(k) == 0xffffffff) k += 32;
            while (ISSET_BH(k)) k++;
         }
         l = k - 1;
         if (l >= nblock) break;
         while (!ISSET_BH(k) && UNALIGNED_BH(k)) k++;
         if (!ISSET_BH(k)) {
            while (WORD_BH(k) == 0x00000000) k += 32;
            while (!ISSET_BH(k)) k++;
         }
         r = k - 1;
         if (r >= nblock) break;

         /*-- now [l, r] bracket current bucket --*/
         if (r > l) {
            nNotDone += (r - l + 1);
            fallbackQSort3 ( fmap, eclass, l, r );

            /*-- scan bucket and generate header bits-- */
            cc = -1;
            for (i = l; i <= r; i++) {
               cc1 = eclass[fmap[i]];
               if (cc != cc1) { SET_BH(i); cc = cc1; };
            }
         }
      }

      if (verb >= 4) 
         VPrintf1 ( "%6d unresolved strings\n", nNotDone );

      H *= 2;
      if (H > nblock || nNotDone == 0) break;
   }

   /*-- 
      Reconstruct the original block in
      eclass8 [0 .. nblock-1], since the
      previous phase destroyed it.
   --*/
   if (verb >= 4)
      VPrintf0 ( "        reconstructing block ...\n" );
   j = 0;
   for (i = 0; i < nblock; i++) {
      while (ftabCopy[j] == 0) j++;
      ftabCopy[j]--;
      eclass8[fmap[i]] = (UChar)j;
   }
   AssertH ( j < 256, 1005 );
}